

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

bool __thiscall Reducer::reduceFunctions(Reducer *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> __args;
  char *pcVar3;
  bool bVar4;
  ostream *poVar5;
  ostream *poVar6;
  size_type sVar7;
  long lVar8;
  undefined7 extraout_var;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar15;
  size_t max;
  Name NVar16;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_d0;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_c8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_b0;
  ulong local_98;
  size_t local_90;
  undefined1 auStack_88 [8];
  value_type name;
  ulong local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  pointer pNStack_48;
  vector<wasm::Name,_std::allocator<wasm::Name>_> functionNames;
  
  pNStack_48 = (pointer)0x0;
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar15 = *(pointer *)
             &(pMVar1->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            + 8);
  if (puVar15 == puVar2) {
    return false;
  }
  do {
    __args.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (puVar15->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
    ;
    if (functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start ==
        functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_48,
                 (iterator)
                 functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (Name *)__args.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    else {
      pcVar3 = *(char **)((long)__args.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
      ((functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start)->super_IString).str._M_len =
           *(size_t *)
            __args.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      ((functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar3;
      functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start =
           functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    puVar15 = puVar15 + 1;
  } while (puVar15 != puVar2);
  if ((long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pNStack_48 != 0) {
    max = (long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start - (long)pNStack_48 >> 4;
    local_90 = deterministicRandom(this,max);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|    try to remove functions (base: ",0x24);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", decisionCounter: ",0x13);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", numFuncs ",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    if (functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start != pNStack_48) {
      uVar11 = 1;
      uVar13 = CONCAT71((int7)((ulong)poVar5 >> 8),1);
      uVar12 = 0;
      local_70 = 1;
      local_98 = max;
      do {
        uVar9 = (local_90 + uVar12) % local_98;
        if (((uVar13 & 1) == 0) &&
           (sVar7 = std::
                    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count(&functionsWeTriedToRemove._M_h,pNStack_48 + uVar9), sVar7 == 1)) {
          iVar10 = this->factor / 5;
          if (iVar10 < 20000) {
            iVar10 = 19999;
          }
          bVar4 = shouldTryToReduce(this,(ulong)(iVar10 + 1));
          if (bVar4) goto LAB_00128ed0;
          uVar13 = 0;
        }
        else {
LAB_00128ed0:
          auStack_68 = (undefined1  [8])0x0;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (uVar11 == 0) {
            uVar11 = 0;
          }
          else {
            name.super_IString.str._M_str._4_4_ = (uint)uVar13;
            if (uVar9 < (ulong)((long)functionNames.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_start - (long)pNStack_48 >>
                               4)) {
              lVar14 = 0;
              do {
                auStack_88 = (undefined1  [8])pNStack_48[lVar14 + uVar9].super_IString.str._M_len;
                name.super_IString.str._M_len =
                     (size_t)pNStack_48[lVar14 + uVar9].super_IString.str._M_str;
                NVar16.super_IString.str._M_str = (char *)auStack_88;
                NVar16.super_IString.str._M_len =
                     (size_t)(this->module)._M_t.
                             super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                             .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
                lVar8 = wasm::Module::getFunctionOrNull(NVar16);
                if (lVar8 != 0) {
                  if (names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    std::vector<wasm::Name,std::allocator<wasm::Name>>::
                    _M_realloc_insert<wasm::Name_const&>
                              ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_68,
                               (iterator)
                               names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                               _M_impl.super__Vector_impl_data._M_start,(Name *)auStack_88);
                  }
                  else {
                    *(undefined4 *)
                     &((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_IString).str._M_len =
                         auStack_88._0_4_;
                    *(undefined4 *)
                     ((long)&((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                               _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len
                     + 4) = auStack_88._4_4_;
                    *(undefined4 *)
                     &((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_IString).str._M_str =
                         (undefined4)name.super_IString.str._M_len;
                    *(undefined4 *)
                     ((long)&((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                               _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_str
                     + 4) = name.super_IString.str._M_len._4_4_;
                    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
                  }
                  local_d0 = &functionsWeTriedToRemove;
                  std::
                  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                            ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&functionsWeTriedToRemove,auStack_88,&local_d0);
                }
              } while (((ulong)((long)names.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_start - (long)auStack_68 >>
                               4) < uVar11) &&
                      (lVar8 = lVar14 + uVar9, lVar14 = lVar14 + 1,
                      lVar8 + 1U <
                      (ulong)((long)functionNames.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start - (long)pNStack_48 >> 4
                             )));
            }
            if ((undefined1  [8])
                names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start == auStack_68) {
              uVar13 = (ulong)name.super_IString.str._M_str._4_4_;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"|     trying at i=",0x12);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," of size ",9);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                        (&local_c8,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_68);
              bVar4 = tryToEmptyFunctions(this,&local_c8);
              uVar13 = CONCAT71((int7)((ulong)poVar5 >> 8),1);
              if (!bVar4) {
                std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                          (&local_b0,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_68);
                bVar4 = tryToRemoveFunctions(this,&local_b0);
                uVar13 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
                if (local_b0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b0.
                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_b0.
                                        super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_b0.
                                        super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              if (local_c8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_c8.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c8.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((char)uVar13 == '\0') {
                if (uVar11 != 1) {
                  uVar11 = uVar11 >> 1;
                }
                lVar14 = (long)(this->factor / 100);
              }
              else {
                this->reduced =
                     this->reduced +
                     ((long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)auStack_68 >> 4);
                applyTestToWorking(this);
                lVar14 = uVar11 - 1;
                uVar11 = uVar11 * 2;
                if ((ulong)(long)this->factor <= uVar11) {
                  uVar11 = (long)this->factor;
                }
                if (local_70 < uVar11) {
                  local_70 = uVar11;
                }
              }
              uVar12 = uVar12 + lVar14;
            }
            if (auStack_68 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_68,
                              (long)names.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
            }
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)functionNames.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_start - (long)pNStack_48 >>
                               4));
      bVar4 = 2 < local_70;
      goto LAB_00129163;
    }
  }
  bVar4 = false;
LAB_00129163:
  if (pNStack_48 != (pointer)0x0) {
    operator_delete(pNStack_48,
                    (long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pNStack_48);
  }
  return bVar4;
}

Assistant:

bool reduceFunctions() {
    // try to remove functions
    std::vector<Name> functionNames;
    for (auto& func : module->functions) {
      functionNames.push_back(func->name);
    }
    auto numFuncs = functionNames.size();
    if (numFuncs == 0) {
      return false;
    }
    size_t skip = 1;
    size_t maxSkip = 1;
    // If we just removed some functions in the previous iteration, keep trying
    // to remove more as this is one of the most efficient ways to reduce.
    bool justReduced = true;
    // Start from a new place each time.
    size_t base = deterministicRandom(numFuncs);
    std::cerr << "|    try to remove functions (base: " << base
              << ", decisionCounter: " << decisionCounter << ", numFuncs "
              << numFuncs << ")\n";
    for (size_t x = 0; x < functionNames.size(); x++) {
      size_t i = (base + x) % numFuncs;
      if (!justReduced &&
          functionsWeTriedToRemove.count(functionNames[i]) == 1 &&
          !shouldTryToReduce(std::max((factor / 5) + 1, 20000))) {
        continue;
      }
      std::vector<Name> names;
      for (size_t j = 0; names.size() < skip && i + j < functionNames.size();
           j++) {
        auto name = functionNames[i + j];
        if (module->getFunctionOrNull(name)) {
          names.push_back(name);
          functionsWeTriedToRemove.insert(name);
        }
      }
      if (names.size() == 0) {
        continue;
      }
      std::cerr << "|     trying at i=" << i << " of size " << names.size()
                << "\n";
      // Try to remove functions and/or empty them. Note that
      // tryToRemoveFunctions() will reload the module if it fails, which means
      // function names may change - for that reason, run it second.
      justReduced = tryToEmptyFunctions(names) || tryToRemoveFunctions(names);
      if (justReduced) {
        noteReduction(names.size());
        // Subtract 1 since the loop increments us anyhow by one: we want to
        // skip over the skipped functions, and not any more.
        x += skip - 1;
        skip = std::min(size_t(factor), 2 * skip);
        maxSkip = std::max(skip, maxSkip);
      } else {
        skip = std::max(skip / 2, size_t(1)); // or 1?
        x += factor / 100;
      }
    }
    // If maxSkip is 1 then we never reduced at all. If it is 2 then we did
    // manage to reduce individual functions, but all our attempts at
    // exponential growth failed. Only suggest doing a new iteration of this
    // function if we did in fact manage to grow, which indicated there are lots
    // of opportunities here, and it is worth focusing on this.
    return maxSkip > 2;
  }